

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int compare_attr_p_by_val(attr_p a1,attr_p a2)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int eq;
  attr_list in_stack_00000020;
  attr_list in_stack_00000028;
  bool local_1e;
  bool local_1d;
  uint local_1c;
  uint local_4;
  
  local_1c = 0;
  if (in_RDI == in_RSI) {
    local_4 = 1;
  }
  else {
    if (*(int *)(in_RDI + 4) == *(int *)(in_RSI + 4)) {
      if ((*(int *)(in_RDI + 4) == 1) || (*(int *)(in_RDI + 4) == 2)) {
        local_1c = (uint)(*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8));
      }
      else if (*(int *)(in_RDI + 4) == 3) {
        iVar1 = strcmp(*(char **)(in_RDI + 8),"*");
        local_1d = true;
        if (iVar1 != 0) {
          iVar1 = strcmp(*(char **)(in_RSI + 8),"*");
          local_1d = true;
          if (iVar1 != 0) {
            iVar1 = strcmp(*(char **)(in_RDI + 8),*(char **)(in_RSI + 8));
            local_1d = iVar1 == 0;
          }
        }
        local_1c = (uint)local_1d;
      }
      else if (*(int *)(in_RDI + 4) == 4) {
        local_1e = false;
        if (*(int *)(in_RDI + 8) == *(int *)(in_RSI + 8)) {
          iVar1 = memcmp(*(void **)(in_RDI + 0x10),*(void **)(in_RSI + 0x10),
                         (long)*(int *)(in_RDI + 8));
          local_1e = iVar1 == 0;
        }
        local_1c = (uint)local_1e;
      }
      else if (*(int *)(in_RDI + 4) == 5) {
        local_1c = (uint)(*(int *)(in_RDI + 8) == *(int *)(in_RSI + 8));
      }
      else if (*(int *)(in_RDI + 4) == 6) {
        local_1c = attr_list_subset(in_stack_00000028,in_stack_00000020);
      }
      else {
        local_1c = 1;
      }
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

extern
int
compare_attr_p_by_val (attr_p a1, attr_p a2)
{
  int eq = 0;
  
  if (a1 == a2)
    return 1;

  if (a1->val_type == a2->val_type)
    {
      if (a1->val_type == Attr_Int4 ||
	  a1->val_type == Attr_Int8)
	{
	  eq = ATTR_INT4_8_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_String)
	{
	  eq = ATTR_STRING_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_Opaque)
	{
	  eq = ATTR_OPAQUE_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_Atom)
	{
	  eq = ATTR_ATOM_EQ(a1,a2);
	}
      else if (a1->val_type == Attr_List)
	{
	  eq = attr_list_subset ((attr_list)a1->value.u.p,
				 (attr_list)a2->value.u.p);
	}
      else
	{
	  eq = 1;
	}

    }
  
  return eq;
}